

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::init
          (UserDefinedIOCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  undefined8 uVar2;
  int iVar3;
  RenderTarget *renderTarget;
  char *pcVar4;
  IOBlock *pIVar5;
  Variable *pVVar6;
  size_type sVar7;
  reference pvVar8;
  TopLevelObject *pTVar9;
  ContextInfo *pCVar10;
  ShaderProgram *pSVar11;
  RenderContext *renderCtx;
  Context *pCVar12;
  ProgramSources *pPVar13;
  TestLog *log;
  TestError *this_00;
  int precision;
  int precision_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  bool bVar15;
  uint local_11b4;
  uint local_11b0;
  uint local_11ac;
  uint local_11a8;
  uint local_116c;
  uint local_1168;
  uint local_1164;
  uint local_1160;
  bool local_1039;
  bool local_102a;
  TransformFeedbackMode local_1028;
  allocator<char> local_1021;
  string local_1020;
  TransformFeedbackVarying local_1000;
  string local_fe0;
  ShaderSource local_fc0;
  string local_f98;
  ShaderSource local_f78;
  string local_f50;
  ShaderSource local_f30;
  string local_f08;
  ShaderSource local_ee8;
  ProgramSources local_ec0;
  SharedPtr<const_glu::ShaderProgram> local_df0;
  allocator<char> local_dd9;
  string local_dd8 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18;
  undefined1 local_cf8 [8];
  string tessellationEvaluationTemplate;
  string local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  undefined1 local_c10 [8];
  string tessellationControlTemplate;
  string local_be8 [8];
  string vertexShaderTemplate;
  string local_ba8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  byte local_ae2;
  allocator<char> local_ae1;
  int local_ae0 [2];
  string local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  byte local_a75;
  uint local_a74;
  bool isArray_1;
  TopLevelObject *pTStack_a70;
  int numElements_1;
  TopLevelObject *input;
  undefined1 local_a60 [4];
  int tesInputNdx;
  string local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  string local_9e0;
  int local_9bc;
  string local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  string local_918 [32];
  string local_8f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  string local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  byte local_7d2;
  allocator<char> local_7d1;
  int local_7d0 [4];
  string local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  byte local_75d;
  uint local_75c;
  bool isArray;
  TopLevelObject *pTStack_758;
  int numElements;
  TopLevelObject *output;
  undefined1 local_748 [4];
  int tcsOutputNdx;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  Variable local_6a0;
  string local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
  local_618;
  SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
  local_608;
  SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
  local_5f8;
  SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
  local_5e8;
  allocator<char> local_5d1;
  string local_5d0;
  undefined1 local_5b0 [8];
  Variable var1;
  string local_560;
  undefined1 local_540 [8];
  Variable var0;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
  local_4a8;
  undefined1 local_492;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
  local_448;
  allocator<char> local_431;
  string local_430;
  Member local_410;
  VarType local_3d8;
  allocator<char> local_3b9;
  string local_3b8;
  Member local_398;
  VarType local_360;
  allocator<char> local_341;
  string local_340;
  Member local_320;
  allocator<char> local_2e1;
  string local_2e0;
  Member local_2c0;
  undefined1 local_288 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  blockMembers;
  undefined1 local_268 [7];
  bool useLightweightBlock;
  VarType local_250;
  VarType local_238;
  byte local_219;
  undefined1 local_218 [7];
  bool usedStruct;
  VarType structVarType;
  StructType *structType;
  VarType highpFloat;
  undefined1 local_1a8 [8];
  string tesStatements;
  string tesDeclarations;
  string tcsStatements;
  string tcsDeclarations;
  undefined1 local_120 [7];
  bool useBlock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string inMaybePatch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string outMaybePatch;
  char *maybePatch;
  byte local_4e;
  allocator<char> local_4d [19];
  byte local_3a;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string vertexAttrArrayInputSize;
  bool isExplicitVertexArraySize;
  bool isPerPatchIO;
  UserDefinedIOCase *this_local;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  local_102a = true;
  if (((this->m_ioType != IO_TYPE_PER_PATCH) &&
      (local_102a = true, this->m_ioType != IO_TYPE_PER_PATCH_ARRAY)) &&
     (local_102a = true, this->m_ioType != IO_TYPE_PER_PATCH_BLOCK)) {
    local_102a = this->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;
  }
  vertexAttrArrayInputSize.field_2._M_local_buf[0xf] = local_102a;
  local_1039 = true;
  if (this->m_vertexIOArraySize != VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
    local_1039 = this->m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY;
  }
  vertexAttrArrayInputSize.field_2._M_local_buf[0xe] = local_1039;
  local_3a = 0;
  local_4e = 0;
  maybePatch._2_1_ = 0;
  if (this->m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_IMPLICIT) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"",&local_39);
  }
  else if (this->m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
    std::allocator<char>::allocator();
    local_4e = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,"gl_MaxPatchVertices",local_4d);
  }
  else if (this->m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY) {
    pCVar10 = Context::getContextInfo((this->super_TestCase).m_context);
    maybePatch._4_4_ = (*pCVar10->_vptr_ContextInfo[2])(pCVar10,0x8e7d);
    de::toString<int>((string *)local_38,(int *)((long)&maybePatch + 4));
  }
  else {
    std::allocator<char>::allocator();
    maybePatch._2_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,(char *)0x0,(allocator<char> *)((long)&maybePatch + 3));
  }
  if ((maybePatch._2_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&maybePatch + 3));
  }
  if ((local_4e & 1) != 0) {
    std::allocator<char>::~allocator(local_4d);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator(&local_39);
  }
  pcVar4 = "";
  if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar4 = "patch ";
  }
  outMaybePatch.field_2._8_8_ = pcVar4;
  std::__cxx11::string::string((string *)(inMaybePatch.field_2._M_local_buf + 8));
  std::operator+(&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (inMaybePatch.field_2._M_local_buf + 8),(char *)outMaybePatch.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &local_a0,"out ");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)(inMaybePatch.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_120);
  std::operator+(&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 (char *)outMaybePatch.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &local_100,"in ");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_120);
  bVar15 = true;
  if ((this->m_ioType != IO_TYPE_PER_VERTEX_BLOCK) &&
     (bVar15 = true, this->m_ioType != IO_TYPE_PER_PATCH_BLOCK)) {
    bVar15 = this->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;
  }
  std::__cxx11::string::string((string *)(tcsStatements.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(tesDeclarations.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(tesStatements.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_1a8);
  glu::StructType::StructType((StructType *)((long)&highpFloat.m_data + 8),"S");
  std::vector<glu::StructType,_std::allocator<glu::StructType>_>::push_back
            (&this->m_structTypes,(value_type *)((long)&highpFloat.m_data + 8));
  glu::StructType::~StructType((StructType *)((long)&highpFloat.m_data + 8));
  glu::VarType::VarType((VarType *)&structType,TYPE_FLOAT,PRECISION_HIGHP);
  structVarType.m_data._8_8_ =
       std::vector<glu::StructType,_std::allocator<glu::StructType>_>::back(&this->m_structTypes);
  glu::VarType::VarType((VarType *)local_218,(StructType *)structVarType.m_data._8_8_);
  uVar2 = structVarType.m_data._8_8_;
  local_219 = 0;
  glu::VarType::VarType(&local_238,TYPE_INT,PRECISION_HIGHP);
  glu::StructType::addMember((StructType *)uVar2,"x",&local_238);
  glu::VarType::~VarType(&local_238);
  uVar2 = structVarType.m_data._8_8_;
  glu::VarType::VarType(&local_250,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember((StructType *)uVar2,"y",&local_250);
  glu::VarType::~VarType(&local_250);
  uVar2 = structVarType.m_data._8_8_;
  if (bVar15) {
    glu::VarType::VarType((VarType *)local_268,(VarType *)&structType,2);
    glu::StructType::addMember((StructType *)uVar2,"z",(VarType *)local_268);
    glu::VarType::~VarType((VarType *)local_268);
    blockMembers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         this->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
              *)local_288);
    if ((blockMembers.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"blockS",&local_2e1);
      IOBlock::Member::Member(&local_2c0,&local_2e0,(VarType *)local_218);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                   *)local_288,&local_2c0);
      IOBlock::Member::~Member(&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator(&local_2e1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"blockFa",&local_341);
    glu::VarType::VarType(&local_360,(VarType *)&structType,3);
    IOBlock::Member::Member(&local_320,&local_340,&local_360);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                 *)local_288,&local_320);
    IOBlock::Member::~Member(&local_320);
    glu::VarType::~VarType(&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator(&local_341);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"blockSa",&local_3b9);
    glu::VarType::VarType(&local_3d8,(VarType *)local_218,2);
    IOBlock::Member::Member(&local_398,&local_3b8,&local_3d8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                 *)local_288,&local_398);
    IOBlock::Member::~Member(&local_398);
    glu::VarType::~VarType(&local_3d8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"blockF",&local_431);
    IOBlock::Member::Member(&local_410,&local_430,(VarType *)&structType);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                 *)local_288,&local_410);
    IOBlock::Member::~Member(&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    pIVar5 = (IOBlock *)operator_new(0x60);
    local_492 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"TheBlock",&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"tcBlock",&local_491);
    IOBlock::IOBlock(pIVar5,&local_468,&local_490,
                     (vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                      *)local_288);
    local_492 = 0;
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    SharedPtr(&local_448,(TopLevelObject *)pIVar5);
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tcsOutputs,&local_448);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    ~SharedPtr(&local_448);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    pIVar5 = (IOBlock *)operator_new(0x60);
    var0._70_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"TheBlock",&local_4c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,"teBlock",(allocator<char> *)&var0.field_0x47);
    IOBlock::IOBlock(pIVar5,&local_4c8,&local_4f0,
                     (vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                      *)local_288);
    var0._70_1_ = 0;
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    SharedPtr(&local_4a8,(TopLevelObject *)pIVar5);
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tesInputs,&local_4a8);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    ~SharedPtr(&local_4a8);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&var0.field_0x47);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    local_219 = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
               *)local_288);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_560,"in_te_s",(allocator<char> *)&var1.field_0x47);
    Variable::Variable((Variable *)local_540,&local_560,(VarType *)local_218,
                       this->m_ioType != IO_TYPE_PER_PATCH);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator((allocator<char> *)&var1.field_0x47);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"in_te_f",&local_5d1);
    Variable::Variable((Variable *)local_5b0,&local_5d0,(VarType *)&structType,
                       this->m_ioType != IO_TYPE_PER_PATCH);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator(&local_5d1);
    if (this->m_ioType != IO_TYPE_PER_PATCH_ARRAY) {
      pVVar6 = (Variable *)operator_new(0x48);
      Variable::Variable(pVVar6,(Variable *)local_540);
      de::
      SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
      ::SharedPtr(&local_5e8,(TopLevelObject *)pVVar6);
      std::
      vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
      ::push_back(&this->m_tcsOutputs,&local_5e8);
      de::
      SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
      ::~SharedPtr(&local_5e8);
      pVVar6 = (Variable *)operator_new(0x48);
      Variable::Variable(pVVar6,(Variable *)local_540);
      de::
      SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
      ::SharedPtr(&local_5f8,(TopLevelObject *)pVVar6);
      std::
      vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
      ::push_back(&this->m_tesInputs,&local_5f8);
      de::
      SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
      ::~SharedPtr(&local_5f8);
      local_219 = 1;
    }
    pVVar6 = (Variable *)operator_new(0x48);
    Variable::Variable(pVVar6,(Variable *)local_5b0);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    SharedPtr(&local_608,(TopLevelObject *)pVVar6);
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tcsOutputs,&local_608);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    ~SharedPtr(&local_608);
    pVVar6 = (Variable *)operator_new(0x48);
    Variable::Variable(pVVar6,(Variable *)local_5b0);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    SharedPtr(&local_618,(TopLevelObject *)pVVar6);
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tesInputs,&local_618);
    de::
    SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>::
    ~SharedPtr(&local_618);
    Variable::~Variable((Variable *)local_5b0);
    Variable::~Variable((Variable *)local_540);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"in_tc_attr",&local_6c1);
  Variable::Variable(&local_6a0,&local_6c0,(VarType *)&structType,true);
  Variable::declareArray(&local_658,&local_6a0,(string *)local_38);
  std::operator+(&local_638,"in ",&local_658);
  std::__cxx11::string::operator+=
            ((string *)(tcsStatements.field_2._M_local_buf + 8),(string *)&local_638);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_658);
  Variable::~Variable(&local_6a0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  if ((local_219 & 1) != 0) {
    glu::declare((DeclareStructType *)local_748,(StructType *)structVarType.m_data._8_8_,0);
    de::toString<glu::decl::DeclareStructType>(&local_708,(DeclareStructType *)local_748);
    std::operator+(&local_6e8,&local_708,";\n");
    std::__cxx11::string::operator+=
              ((string *)(tcsStatements.field_2._M_local_buf + 8),(string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_708);
    glu::decl::DeclareStructType::~DeclareStructType((DeclareStructType *)local_748);
  }
  std::__cxx11::string::operator+=
            ((string *)(tesDeclarations.field_2._M_local_buf + 8),"\t{\n\t\thighp float v = 1.3;\n")
  ;
  for (output._4_4_ = 0; iVar3 = output._4_4_,
      sVar7 = std::
              vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
              ::size(&this->m_tcsOutputs), iVar3 < (int)sVar7; output._4_4_ = output._4_4_ + 1) {
    pvVar8 = std::
             vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
             ::operator[](&this->m_tcsOutputs,(long)output._4_4_);
    pTVar9 = de::
             SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
             ::operator*(pvVar8);
    if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xf] & 1U) == 0) {
      local_1160 = 0xffffffff;
    }
    else {
      if (this->m_ioType == IO_TYPE_PER_PATCH) {
        local_1164 = 1;
      }
      else {
        if (this->m_ioType == IO_TYPE_PER_PATCH_ARRAY) {
          local_1168 = 3;
        }
        else {
          if (this->m_ioType == IO_TYPE_PER_PATCH_BLOCK) {
            local_116c = 1;
          }
          else {
            local_116c = 0xfffffffe;
            if (this->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
              local_116c = 2;
            }
          }
          local_1168 = local_116c;
        }
        local_1164 = local_1168;
      }
      local_1160 = local_1164;
    }
    local_75c = local_1160;
    local_75d = local_1160 != 1;
    pTStack_758 = pTVar9;
    if ((bool)local_75d) {
      local_7d2 = 0;
      if (this->m_ioType == IO_TYPE_PER_PATCH_ARRAY) {
        local_7d0[3] = 3;
        de::toString<int>(&local_7c0,local_7d0 + 3);
      }
      else if (this->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
        local_7d0[2] = 2;
        de::toString<int>(&local_7c0,local_7d0 + 2);
      }
      else if (this->m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT) {
        local_7d0[1] = 5;
        de::toString<int>(&local_7c0,local_7d0 + 1);
      }
      else if (this->m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_QUERY) {
        pCVar10 = Context::getContextInfo((this->super_TestCase).m_context);
        local_7d0[0] = (*pCVar10->_vptr_ContextInfo[2])(pCVar10,0x8e7d);
        de::toString<int>(&local_7c0,local_7d0);
      }
      else {
        pcVar4 = "";
        if (this->m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN) {
          pcVar4 = "gl_MaxPatchVertices";
        }
        std::allocator<char>::allocator();
        local_7d2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,pcVar4,&local_7d1);
      }
      (*pTVar9->_vptr_TopLevelObject[4])(&local_7a0,pTVar9,&local_7c0);
      std::operator+(&local_780,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     &local_7a0);
      std::__cxx11::string::operator+=
                ((string *)(tcsStatements.field_2._M_local_buf + 8),(string *)&local_780);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_7c0);
      if ((local_7d2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_7d1);
      }
    }
    else {
      (*pTVar9->_vptr_TopLevelObject[3])(&local_818);
      std::operator+(&local_7f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     &local_818);
      std::__cxx11::string::operator+=
                ((string *)(tcsStatements.field_2._M_local_buf + 8),(string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
    }
    if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xf] & 1U) == 0) {
      iVar3 = (*pTStack_758->_vptr_TopLevelObject[7])();
      de::floatToString_abi_cxx11_(&local_878,(de *)&DAT_00000001,(float)iVar3 * 0.4,precision);
      std::operator+(&local_858,"\t\tv += float(gl_InvocationID)*",&local_878);
      std::operator+(&local_838,&local_858,";\n");
      std::__cxx11::string::operator+=
                ((string *)(tesDeclarations.field_2._M_local_buf + 8),(string *)&local_838);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_878);
    }
    (*pTStack_758->_vptr_TopLevelObject[2])(&local_8d8);
    std::operator+(&local_8b8,"\n\t\t// Assign values to output ",&local_8d8);
    std::operator+(&local_898,&local_8b8,"\n");
    std::__cxx11::string::operator+=
              ((string *)(tesDeclarations.field_2._M_local_buf + 8),(string *)&local_898);
    std::__cxx11::string::~string((string *)&local_898);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::__cxx11::string::~string((string *)&local_8d8);
    if ((local_75d & 1) == 0) {
      (*pTStack_758->_vptr_TopLevelObject[6])(local_918,pTStack_758,2,glslAssignBasicTypeObject);
      std::__cxx11::string::operator+=
                ((string *)(tesDeclarations.field_2._M_local_buf + 8),local_918);
      std::__cxx11::string::~string(local_918);
    }
    else {
      (*pTStack_758->_vptr_TopLevelObject[5])
                (local_8f8,pTStack_758,(ulong)local_75c,2,glslAssignBasicTypeObject);
      std::__cxx11::string::operator+=
                ((string *)(tesDeclarations.field_2._M_local_buf + 8),local_8f8);
      std::__cxx11::string::~string(local_8f8);
    }
    if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xf] & 1U) == 0) {
      local_9bc = 5;
      de::toString<int>(&local_9b8,&local_9bc);
      std::operator+(&local_998,"\t\tv += float(",&local_9b8);
      std::operator+(&local_978,&local_998,"-gl_InvocationID-1)*");
      iVar3 = (*pTStack_758->_vptr_TopLevelObject[7])();
      de::floatToString_abi_cxx11_(&local_9e0,(de *)&DAT_00000001,(float)iVar3 * 0.4,precision_00);
      std::operator+(&local_958,&local_978,&local_9e0);
      std::operator+(&local_938,&local_958,";\n");
      std::__cxx11::string::operator+=
                ((string *)(tesDeclarations.field_2._M_local_buf + 8),(string *)&local_938);
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::~string((string *)&local_958);
      std::__cxx11::string::~string((string *)&local_9e0);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::string::~string((string *)&local_998);
      std::__cxx11::string::~string((string *)&local_9b8);
    }
  }
  std::__cxx11::string::operator+=((string *)(tesDeclarations.field_2._M_local_buf + 8),"\t}\n");
  if ((local_219 & 1) != 0) {
    glu::declare((DeclareStructType *)local_a60,(StructType *)structVarType.m_data._8_8_,0);
    de::toString<glu::decl::DeclareStructType>(&local_a20,(DeclareStructType *)local_a60);
    std::operator+(&local_a00,&local_a20,";\n");
    std::__cxx11::string::operator+=
              ((string *)(tesStatements.field_2._M_local_buf + 8),(string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_a20);
    glu::decl::DeclareStructType::~DeclareStructType((DeclareStructType *)local_a60);
  }
  std::__cxx11::string::operator+=
            ((string *)local_1a8,
             "\tbool allOk = true;\n\thighp uint firstFailedInputIndex = 0u;\n\t{\n\t\thighp float v = 1.3;\n"
            );
  for (input._4_4_ = 0; iVar3 = input._4_4_,
      pcVar4 = (char *)std::
                       vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                       ::size(&this->m_tesInputs), iVar3 < (int)pcVar4;
      input._4_4_ = input._4_4_ + 1) {
    pvVar8 = std::
             vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
             ::operator[](&this->m_tesInputs,(long)input._4_4_);
    pTVar9 = de::
             SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
             ::operator*(pvVar8);
    pbVar14 = extraout_RDX;
    if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xf] & 1U) == 0) {
      local_11a8 = 5;
    }
    else {
      if (this->m_ioType == IO_TYPE_PER_PATCH) {
        local_11ac = 1;
      }
      else {
        if (this->m_ioType == IO_TYPE_PER_PATCH_BLOCK) {
          local_11b0 = 1;
        }
        else {
          if (this->m_ioType == IO_TYPE_PER_PATCH_ARRAY) {
            local_11b4 = 3;
          }
          else {
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (ulong)this->m_ioType;
            local_11b4 = 0xfffffffe;
            if (this->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
              local_11b4 = 2;
            }
          }
          local_11b0 = local_11b4;
        }
        local_11ac = local_11b0;
      }
      local_11a8 = local_11ac;
    }
    local_a74 = local_11a8;
    local_a75 = local_11a8 != 1;
    pTStack_a70 = pTVar9;
    if ((bool)local_a75) {
      local_ae2 = 0;
      if (this->m_ioType == IO_TYPE_PER_PATCH_ARRAY) {
        local_ae0[1] = 3;
        de::toString<int>(&local_ad8,local_ae0 + 1);
      }
      else if (this->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
        local_ae0[0] = 2;
        de::toString<int>(&local_ad8,local_ae0);
      }
      else if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xe] & 1U) == 0) {
        std::allocator<char>::allocator();
        local_ae2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,"",&local_ae1);
      }
      else {
        de::toString<std::__cxx11::string>(&local_ad8,(de *)local_38,pbVar14);
      }
      (*pTVar9->_vptr_TopLevelObject[4])(&local_ab8,pTVar9,&local_ad8);
      std::operator+(&local_a98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &local_ab8);
      std::__cxx11::string::operator+=
                ((string *)(tesStatements.field_2._M_local_buf + 8),(string *)&local_a98);
      std::__cxx11::string::~string((string *)&local_a98);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::__cxx11::string::~string((string *)&local_ad8);
      if ((local_ae2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_ae1);
      }
    }
    else {
      (*pTVar9->_vptr_TopLevelObject[3])(&local_b28);
      std::operator+(&local_b08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &local_b28);
      std::__cxx11::string::operator+=
                ((string *)(tesStatements.field_2._M_local_buf + 8),(string *)&local_b08);
      std::__cxx11::string::~string((string *)&local_b08);
      std::__cxx11::string::~string((string *)&local_b28);
    }
    (*pTStack_a70->_vptr_TopLevelObject[2])(&local_b88);
    std::operator+(&local_b68,"\n\t\t// Check values in input ",&local_b88);
    std::operator+(&local_b48,&local_b68,"\n");
    std::__cxx11::string::operator+=((string *)local_1a8,(string *)&local_b48);
    std::__cxx11::string::~string((string *)&local_b48);
    std::__cxx11::string::~string((string *)&local_b68);
    std::__cxx11::string::~string((string *)&local_b88);
    if ((local_a75 & 1) == 0) {
      (*pTStack_a70->_vptr_TopLevelObject[6])
                ((undefined1 *)((long)&vertexShaderTemplate.field_2 + 8),pTStack_a70,2,
                 glslCheckBasicTypeObject);
      std::__cxx11::string::operator+=
                ((string *)local_1a8,(string *)(vertexShaderTemplate.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(vertexShaderTemplate.field_2._M_local_buf + 8));
    }
    else {
      (*pTStack_a70->_vptr_TopLevelObject[5])
                (local_ba8,pTStack_a70,(ulong)local_a74,2,glslCheckBasicTypeObject);
      std::__cxx11::string::operator+=((string *)local_1a8,local_ba8);
      std::__cxx11::string::~string(local_ba8);
    }
  }
  std::__cxx11::string::operator+=((string *)local_1a8,"\t}\n");
  glu::VarType::~VarType((VarType *)local_218);
  glu::VarType::~VarType((VarType *)&structType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_be8,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,(allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
  tessellationEvaluationTemplate.field_2._12_4_ = 5;
  de::toString<int>(&local_cd0,(int *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xc));
  std::operator+(&local_cb0,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &local_cd0);
  std::operator+(&local_c90,&local_cb0,") out;\n\n");
  std::operator+(&local_c70,&local_c90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tcsStatements.field_2 + 8));
  std::operator+(&local_c50,&local_c70,
                 "\npatch out highp vec2 in_te_positionScale;\npatch out highp vec2 in_te_positionOffset;\n\nvoid main (void)\n{\n"
                );
  std::operator+(&local_c30,&local_c50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tesDeclarations.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c10,
                 &local_c30,
                 "\n\tin_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n\tin_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::~string((string *)&local_c50);
  std::__cxx11::string::~string((string *)&local_c70);
  std::__cxx11::string::~string((string *)&local_c90);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::__cxx11::string::~string((string *)&local_cd0);
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)((long)&fragmentShaderTemplate.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)this->m_primitiveType,TESSPRIMITIVETYPE_TRIANGLES,
             SUB81(pcVar4,0));
  std::operator+(&local_d98,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragmentShaderTemplate.field_2 + 8));
  std::operator+(&local_d78,&local_d98,"\n");
  std::operator+(&local_d58,&local_d78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tesStatements.field_2 + 8));
  std::operator+(&local_d38,&local_d58,
                 "\npatch in highp vec2 in_te_positionScale;\npatch in highp vec2 in_te_positionOffset;\n\nout highp vec4 in_f_color;\n// Will contain the index of the first incorrect input,\n// or the number of inputs if all are correct\nflat out highp uint out_te_firstFailedInputIndex;\n\nbool compare_int   (int   a, int   b) { return a == b; }\nbool compare_float (float a, float b) { return abs(a - b) < 0.01f; }\nbool compare_vec4  (vec4  a, vec4  b) { return all(lessThan(abs(a - b), vec4(0.01f))); }\n\nvoid main (void)\n{\n"
                );
  std::operator+(&local_d18,&local_d38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cf8,
                 &local_d18,
                 "\n\tgl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n\tin_f_color = allOk ? vec4(0.0, 1.0, 0.0, 1.0)\n\t                   : vec4(1.0, 0.0, 0.0, 1.0);\n\tout_te_firstFailedInputIndex = firstFailedInputIndex;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_d18);
  std::__cxx11::string::~string((string *)&local_d38);
  std::__cxx11::string::~string((string *)&local_d58);
  std::__cxx11::string::~string((string *)&local_d78);
  std::__cxx11::string::~string((string *)&local_d98);
  std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_dd8,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,&local_dd9);
  std::allocator<char>::~allocator(&local_dd9);
  pSVar11 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_ec0);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar12 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_f08,(_anonymous_namespace_ *)pCVar1,pCVar12,pcVar4);
  glu::VertexSource::VertexSource((VertexSource *)&local_ee8,&local_f08);
  pPVar13 = glu::ProgramSources::operator<<(&local_ec0,&local_ee8);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar12 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_f50,(_anonymous_namespace_ *)pCVar1,pCVar12,pcVar4);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_f30,&local_f50);
  pPVar13 = glu::ProgramSources::operator<<(pPVar13,&local_f30);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar12 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_f98,(_anonymous_namespace_ *)pCVar1,pCVar12,pcVar4);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_f78,&local_f98);
  pPVar13 = glu::ProgramSources::operator<<(pPVar13,&local_f78);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar12 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_fe0,(_anonymous_namespace_ *)pCVar1,pCVar12,pcVar4);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_fc0,&local_fe0);
  pPVar13 = glu::ProgramSources::operator<<(pPVar13,&local_fc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1020,"out_te_firstFailedInputIndex",&local_1021);
  glu::TransformFeedbackVarying::TransformFeedbackVarying(&local_1000,&local_1020);
  pPVar13 = glu::ProgramSources::operator<<(pPVar13,&local_1000);
  glu::TransformFeedbackMode::TransformFeedbackMode(&local_1028,0x8c8c);
  pPVar13 = glu::ProgramSources::operator<<(pPVar13,&local_1028);
  glu::ShaderProgram::ShaderProgram(pSVar11,renderCtx,pPVar13);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_df0,pSVar11);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_df0);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_df0);
  glu::TransformFeedbackVarying::~TransformFeedbackVarying(&local_1000);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator(&local_1021);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_fc0);
  std::__cxx11::string::~string((string *)&local_fe0);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_f78);
  std::__cxx11::string::~string((string *)&local_f98);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_f30);
  std::__cxx11::string::~string((string *)&local_f50);
  glu::VertexSource::~VertexSource((VertexSource *)&local_ee8);
  std::__cxx11::string::~string((string *)&local_f08);
  glu::ProgramSources::~ProgramSources(&local_ec0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar11 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar11);
  pSVar11 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar15 = glu::ShaderProgram::isOk(pSVar11);
  if (!bVar15) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x183e);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string(local_dd8);
  std::__cxx11::string::~string((string *)local_cf8);
  std::__cxx11::string::~string((string *)local_c10);
  std::__cxx11::string::~string(local_be8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)(tesStatements.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(tesDeclarations.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(tcsStatements.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_80);
  iVar3 = std::__cxx11::string::~string((string *)local_38);
  return iVar3;
}

Assistant:

void UserDefinedIOCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const bool			isPerPatchIO				= m_ioType == IO_TYPE_PER_PATCH				||
													  m_ioType == IO_TYPE_PER_PATCH_ARRAY		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	const bool			isExplicitVertexArraySize	= m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN ||
													  m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY;

	const string		vertexAttrArrayInputSize	= m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_IMPLICIT					? ""
													: m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN	? "gl_MaxPatchVertices"
													: m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY			? de::toString(m_context.getContextInfo().getInt(GL_MAX_PATCH_VERTICES))
													: DE_NULL;

	const char* const	maybePatch					= isPerPatchIO ? "patch " : "";
	const string		outMaybePatch				= string() + maybePatch + "out ";
	const string		inMaybePatch				= string() + maybePatch + "in ";
	const bool			useBlock					= m_ioType == IO_TYPE_PER_VERTEX_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	string				tcsDeclarations;
	string				tcsStatements;

	string				tesDeclarations;
	string				tesStatements;

	{
		m_structTypes.push_back(glu::StructType("S"));

		const glu::VarType	highpFloat		(glu::TYPE_FLOAT, glu::PRECISION_HIGHP);
		glu::StructType&	structType		= m_structTypes.back();
		const glu::VarType	structVarType	(&structType);
		bool				usedStruct		= false;

		structType.addMember("x", glu::VarType(glu::TYPE_INT, glu::PRECISION_HIGHP));
		structType.addMember("y", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		if (useBlock)
		{
			// It is illegal to have a structure containing an array as an output variable
			structType.addMember("z", glu::VarType(highpFloat, 2));
		}

		if (useBlock)
		{
			const bool				useLightweightBlock = (m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY); // use leaner block to make sure it is not larger than allowed (per-patch storage is very limited)
			vector<IOBlock::Member>	blockMembers;

			if (!useLightweightBlock)
				blockMembers.push_back(IOBlock::Member("blockS",	structVarType));

			blockMembers.push_back(IOBlock::Member("blockFa",	glu::VarType(highpFloat, 3)));
			blockMembers.push_back(IOBlock::Member("blockSa",	glu::VarType(structVarType, 2)));
			blockMembers.push_back(IOBlock::Member("blockF",	highpFloat));

			m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "tcBlock", blockMembers)));
			m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "teBlock", blockMembers)));

			usedStruct = true;
		}
		else
		{
			const Variable var0("in_te_s", structVarType,	m_ioType != IO_TYPE_PER_PATCH);
			const Variable var1("in_te_f", highpFloat,		m_ioType != IO_TYPE_PER_PATCH);

			if (m_ioType != IO_TYPE_PER_PATCH_ARRAY)
			{
				// Arrays of structures are disallowed, add struct cases only if not arrayed variable
				m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var0)));
				m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var0)));

				usedStruct = true;
			}

			m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var1)));
			m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var1)));
		}

		tcsDeclarations += "in " + Variable("in_tc_attr", highpFloat, true).declareArray(vertexAttrArrayInputSize);

		if (usedStruct)
			tcsDeclarations += de::toString(glu::declare(structType)) + ";\n";

		tcsStatements += "\t{\n"
						 "\t\thighp float v = 1.3;\n";

		for (int tcsOutputNdx = 0; tcsOutputNdx < (int)m_tcsOutputs.size(); tcsOutputNdx++)
		{
			const TopLevelObject&	output		= *m_tcsOutputs[tcsOutputNdx];
			const int				numElements	= !isPerPatchIO								? -1	//!< \note -1 means indexing with gl_InstanceID
												: m_ioType == IO_TYPE_PER_PATCH				? 1
												: m_ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: -2;
			const bool				isArray		= (numElements != 1);

			DE_ASSERT(numElements != -2);

			if (isArray)
			{
				tcsDeclarations += outMaybePatch + output.declareArray(m_ioType == IO_TYPE_PER_PATCH_ARRAY											? de::toString(int(NUM_PER_PATCH_ARRAY_ELEMS))
																	   : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY									? de::toString(int(NUM_PER_PATCH_BLOCKS))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT			? de::toString(int(NUM_OUTPUT_VERTICES))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_QUERY				? de::toString(m_context.getContextInfo().getInt(GL_MAX_PATCH_VERTICES))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN	? "gl_MaxPatchVertices"
																	   : "");
			}
			else
				tcsDeclarations += outMaybePatch + output.declare();

			if (!isPerPatchIO)
				tcsStatements += "\t\tv += float(gl_InvocationID)*" + de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) + ";\n";

			tcsStatements += "\n\t\t// Assign values to output " + output.name() + "\n";
			if (isArray)
				tcsStatements += output.glslTraverseBasicTypeArray(numElements, 2, glslAssignBasicTypeObject);
			else
				tcsStatements += output.glslTraverseBasicType(2, glslAssignBasicTypeObject);

			if (!isPerPatchIO)
				tcsStatements += "\t\tv += float(" + de::toString(int(NUM_OUTPUT_VERTICES)) + "-gl_InvocationID-1)*" + de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) + ";\n";
		}
		tcsStatements += "\t}\n";

		if (usedStruct)
			tesDeclarations += de::toString(glu::declare(structType)) + ";\n";

		tesStatements += "\tbool allOk = true;\n"
						 "\thighp uint firstFailedInputIndex = 0u;\n"
						 "\t{\n"
						 "\t\thighp float v = 1.3;\n";
		for (int tesInputNdx = 0; tesInputNdx < (int)m_tesInputs.size(); tesInputNdx++)
		{
			const TopLevelObject&	input		= *m_tesInputs[tesInputNdx];
			const int				numElements	= !isPerPatchIO								? (int)NUM_OUTPUT_VERTICES
												: m_ioType == IO_TYPE_PER_PATCH				? 1
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: -2;
			const bool				isArray		= (numElements != 1);

			DE_ASSERT(numElements != -2);

			if (isArray)
				tesDeclarations += inMaybePatch + input.declareArray(m_ioType == IO_TYPE_PER_PATCH_ARRAY			? de::toString(int(NUM_PER_PATCH_ARRAY_ELEMS))
																	 : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? de::toString(int(NUM_PER_PATCH_BLOCKS))
																	 : isExplicitVertexArraySize					? de::toString(vertexAttrArrayInputSize)
																	 : "");
			else
				tesDeclarations += inMaybePatch + input.declare();

			tesStatements += "\n\t\t// Check values in input " + input.name() + "\n";
			if (isArray)
				tesStatements += input.glslTraverseBasicTypeArray(numElements, 2, glslCheckBasicTypeObject);
			else
				tesStatements += input.glslTraverseBasicType(2, glslCheckBasicTypeObject);
		}
		tesStatements += "\t}\n";
	}

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = " + de::toString(int(NUM_OUTPUT_VERTICES)) + ") out;\n"
												 "\n"
												 + tcsDeclarations +
												 "\n"
												 "patch out highp vec2 in_te_positionScale;\n"
												 "patch out highp vec2 in_te_positionOffset;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tcsStatements +
												 "\n"
												 "	in_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n"
												 "	in_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n"
												 "\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType) +
												 "\n"
												 + tesDeclarations +
												 "\n"
												 "patch in highp vec2 in_te_positionScale;\n"
												 "patch in highp vec2 in_te_positionOffset;\n"
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "// Will contain the index of the first incorrect input,\n"
												 "// or the number of inputs if all are correct\n"
												 "flat out highp uint out_te_firstFailedInputIndex;\n"
												 "\n"
												 "bool compare_int   (int   a, int   b) { return a == b; }\n"
												 "bool compare_float (float a, float b) { return abs(a - b) < 0.01f; }\n"
												 "bool compare_vec4  (vec4  a, vec4  b) { return all(lessThan(abs(a - b), vec4(0.01f))); }\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tesStatements +
												 "\n"
												 "	gl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n"
												 "	in_f_color = allOk ? vec4(0.0, 1.0, 0.0, 1.0)\n"
												 "	                   : vec4(1.0, 0.0, 0.0, 1.0);\n"
												 "	out_te_firstFailedInputIndex = firstFailedInputIndex;\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_firstFailedInputIndex")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}